

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_begin_titled(nk_context *ctx,char *name,char *title,nk_rect bounds,nk_flags flags)

{
  byte *pbVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  nk_window *pnVar5;
  bool bVar6;
  long lVar7;
  nk_hash hash;
  int iVar8;
  nk_page_element *win;
  nk_panel *pnVar9;
  nk_page_element *pnVar10;
  ulong uVar11;
  long lVar12;
  nk_size nVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 uVar20;
  float fVar21;
  float fVar22;
  float local_58;
  float fStack_54;
  
  if ((((ctx != (nk_context *)0x0) && (name != (char *)0x0)) && (title != (char *)0x0)) &&
     (ctx->current == (nk_window *)0x0)) {
    if (*name == '\0') {
      lVar12 = 0;
    }
    else {
      lVar12 = 0;
      do {
        lVar7 = lVar12 + 1;
        lVar12 = lVar12 + 1;
      } while (name[lVar7] != '\0');
    }
    hash = nk_murmur_hash(name,(int)lVar12,0x40);
    win = (nk_page_element *)nk_find_window(ctx,hash,name);
    if (win == (nk_page_element *)0x0) {
      if (*name == '\0') {
        uVar11 = 0;
      }
      else {
        uVar11 = 0;
        do {
          lVar12 = uVar11 + 1;
          uVar11 = uVar11 + 1;
        } while (name[lVar12] != '\0');
      }
      win = nk_create_page_element(ctx);
      if (win == (nk_page_element *)0x0) {
        win = (nk_page_element *)0x0;
      }
      else {
        (win->data).tbl.seq = ctx->seq;
      }
      if (win == (nk_page_element *)0x0) {
        return 0;
      }
      nk_insert_window(ctx,(nk_window *)win,flags >> 8 & NK_INSERT_FRONT);
      (win->data).win.buffer.base = &ctx->memory;
      (win->data).tbl.keys[0x1d] = 1;
      nVar13 = (ctx->memory).allocated;
      (win->data).win.buffer.begin = nVar13;
      (win->data).win.buffer.end = nVar13;
      (win->data).win.buffer.last = nVar13;
      (win->data).win.flags = flags;
      local_58 = bounds.x;
      fStack_54 = bounds.y;
      (win->data).tbl.keys[0x12] = (nk_hash)local_58;
      (win->data).tbl.keys[0x13] = (nk_hash)fStack_54;
      (win->data).tbl.keys[0x14] = (nk_hash)bounds.w;
      (win->data).tbl.keys[0x15] = (nk_hash)bounds.h;
      (win->data).tbl.keys[0] = hash;
      nVar13 = 0x3f;
      if ((uint)uVar11 < 0x3f) {
        nVar13 = uVar11 & 0xffffffff;
      }
      nk_memcopy((void *)((long)&win->data + 8),name,nVar13);
      *(undefined1 *)((long)&win->data + nVar13 + 8) = 0;
      (win->data).win.popup.win = (nk_window *)0x0;
    }
    else {
      (win->data).tbl.keys[0x11] = (win->data).tbl.keys[0x11] & 0xfffffc00 | flags;
      (win->data).tbl.seq = ctx->seq;
    }
    if (ctx->active == (nk_window *)0x0) {
      ctx->active = (nk_window *)win;
    }
    uVar3 = (win->data).tbl.keys[0x11];
    if ((uVar3 >> 0xc & 1) == 0) {
      fVar15 = (ctx->style).window.header.padding.y;
      fVar16 = (ctx->style).window.header.label_padding.y;
      fVar15 = fVar16 + fVar16 + fVar15 + fVar15 + ((ctx->style).font)->height;
      if ((uVar3 >> 0xe & 1) == 0) {
        uVar20 = *(undefined8 *)((long)&win->data + 0x54);
        fVar16 = (float)uVar20;
        fVar17 = (float)((ulong)uVar20 >> 0x20);
      }
      else {
        fVar16 = (win->data).pan.menu.w;
        fVar17 = fVar15;
      }
      uVar20 = *(undefined8 *)((long)&win->data + 0x4c);
      nVar13 = (ctx->memory).allocated;
      (win->data).win.buffer.begin = nVar13;
      (win->data).win.buffer.end = nVar13;
      (win->data).win.buffer.last = nVar13;
      *(nk_rect *)((long)&win->data + 0x68) = nk_null_rect;
      fVar22 = (ctx->input).mouse.buttons[0].clicked_pos.x;
      fVar18 = (float)uVar20;
      fVar19 = (float)((ulong)uVar20 >> 0x20);
      bVar14 = false;
      if ((fVar18 <= fVar22) && (bVar14 = false, fVar22 <= fVar16 + fVar18)) {
        fVar22 = (ctx->input).mouse.buttons[0].clicked_pos.y;
        bVar14 = false;
        if ((fVar19 <= fVar22) && (fVar22 <= fVar17 + fVar19)) {
          if ((ctx->input).mouse.buttons[0].down == 1) {
            bVar14 = (ctx->input).mouse.buttons[0].clicked != 0;
          }
          else {
            bVar14 = false;
          }
        }
      }
      fVar22 = (ctx->input).mouse.pos.x;
      bVar6 = false;
      if ((fVar18 <= fVar22) && (bVar6 = false, fVar22 <= fVar16 + fVar18)) {
        fVar22 = (ctx->input).mouse.pos.y;
        if (fVar19 <= fVar22) {
          bVar6 = fVar22 <= fVar17 + fVar19;
        }
        else {
          bVar6 = false;
        }
      }
      pnVar10 = win;
      if (((win != (nk_page_element *)ctx->active) && (bVar6)) &&
         ((ctx->input).mouse.buttons[0].down == 0)) {
        pnVar10 = (nk_page_element *)(win->data).pan.parent;
        do {
          if (pnVar10 == (nk_page_element *)0x0) {
            pnVar10 = (nk_page_element *)0x0;
            break;
          }
          uVar4 = (pnVar10->data).tbl.keys[0x11];
          if ((uVar4 >> 0xe & 1) == 0) {
            uVar20 = *(undefined8 *)((long)&pnVar10->data + 0x54);
          }
          else {
            uVar20 = CONCAT44(fVar15,(pnVar10->data).tbl.keys[0x14]);
          }
          uVar2 = *(undefined8 *)((long)&pnVar10->data + 0x4c);
          fVar22 = (float)uVar2;
          if (((fVar16 + fVar18 < fVar22) || ((float)uVar20 + fVar22 < fVar18)) ||
             (((~uVar4 & 0x1100) == 0 ||
              ((fVar22 = (float)((ulong)uVar2 >> 0x20), fVar17 + fVar19 < fVar22 ||
               ((float)((ulong)uVar20 >> 0x20) + fVar22 < fVar19)))))) {
            pnVar5 = (pnVar10->data).win.popup.win;
            if ((pnVar5 != (nk_window *)0x0) &&
               (((uVar4 >> 0xc & 1) == 0 && ((pnVar10->data).tbl.values[0x13] != 0)))) {
              fVar22 = (pnVar5->bounds).x;
              fVar21 = (win->data).pan.menu.x;
              if ((fVar22 <= fVar16 + fVar21) &&
                 (((fVar21 <= fVar22 + (pnVar5->bounds).w &&
                   (fVar22 = (pnVar5->bounds).y, fVar22 <= fVar17 + fVar19)) &&
                  (fVar19 <= fVar22 + (pnVar5->bounds).h)))) goto LAB_0010efb9;
            }
            pnVar10 = (nk_page_element *)(pnVar10->data).pan.parent;
            bVar6 = true;
          }
          else {
LAB_0010efb9:
            bVar6 = false;
          }
        } while (bVar6);
      }
      if ((((bool)(pnVar10 != (nk_page_element *)0x0 & bVar14)) &&
          (win != (nk_page_element *)ctx->end)) &&
         ((*(byte *)((long)&pnVar10->data + 0x49) & 1) == 0)) {
        pnVar10 = (nk_page_element *)(win->data).pan.parent;
        do {
          if (pnVar10 == (nk_page_element *)0x0) {
            pnVar10 = (nk_page_element *)0x0;
            break;
          }
          uVar4 = (pnVar10->data).tbl.keys[0x11];
          if ((uVar4 >> 0xe & 1) == 0) {
            uVar20 = *(undefined8 *)((long)&pnVar10->data + 0x54);
          }
          else {
            uVar20 = CONCAT44(fVar15,(pnVar10->data).tbl.keys[0x14]);
          }
          uVar2 = *(undefined8 *)((long)&pnVar10->data + 0x4c);
          fVar22 = (ctx->input).mouse.pos.x;
          fVar21 = (float)uVar2;
          if (((fVar22 < fVar21) || ((float)uVar20 + fVar21 < fVar22)) || ((uVar4 >> 0xc & 1) != 0))
          {
LAB_0010f0db:
            pnVar5 = (pnVar10->data).win.popup.win;
            if (((pnVar5 != (nk_window *)0x0) &&
                (((((uVar4 >> 0xc & 1) == 0 && ((pnVar10->data).tbl.values[0x13] != 0)) &&
                  (fVar22 = (pnVar5->bounds).x, fVar22 <= fVar16 + fVar18)) &&
                 ((fVar18 <= fVar22 + (pnVar5->bounds).w &&
                  (fVar22 = (pnVar5->bounds).y, fVar22 <= fVar17 + fVar19)))))) &&
               (fVar19 <= fVar22 + (pnVar5->bounds).h)) goto LAB_0010f0d7;
            pnVar10 = (nk_page_element *)(pnVar10->data).pan.parent;
            bVar14 = true;
          }
          else {
            fVar21 = (float)((ulong)uVar2 >> 0x20);
            fVar22 = (ctx->input).mouse.pos.y;
            if ((fVar22 < fVar21) || ((float)((ulong)uVar20 >> 0x20) + fVar21 < fVar22))
            goto LAB_0010f0db;
LAB_0010f0d7:
            bVar14 = false;
          }
        } while (bVar14);
      }
      if ((pnVar10 == (nk_page_element *)0x0) && ((nk_page_element *)ctx->end != win)) {
        if ((uVar3 >> 8 & 1) == 0) {
          nk_remove_window(ctx,(nk_window *)win);
          nk_insert_window(ctx,(nk_window *)win,NK_INSERT_BACK);
        }
        pbVar1 = (byte *)((long)&win->data + 0x49);
        *pbVar1 = *pbVar1 & 0xf7;
        ctx->active = (nk_window *)win;
      }
      if (((nk_page_element *)ctx->end != win) &&
         (uVar3 = (win->data).tbl.keys[0x11], (uVar3 >> 8 & 1) == 0)) {
        (win->data).tbl.keys[0x11] = uVar3 | 0x800;
      }
      pnVar9 = (nk_panel *)nk_create_panel(ctx);
      (win->data).win.layout = pnVar9;
      ctx->current = (nk_window *)win;
      iVar8 = nk_panel_begin(ctx,title,NK_PANEL_WINDOW);
      ((win->data).win.layout)->offset = (nk_scroll *)((long)&win->data + 0x5c);
      return iVar8;
    }
    ctx->current = (nk_window *)win;
  }
  return 0;
}

Assistant:

NK_API int
nk_begin_titled(struct nk_context *ctx, const char *name, const char *title,
    struct nk_rect bounds, nk_flags flags)
{
    struct nk_window *win;
    struct nk_style *style;
    nk_hash title_hash;
    int title_len;
    int ret = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(name);
    NK_ASSERT(title);
    NK_ASSERT(ctx->style.font && ctx->style.font->width && "if this triggers you forgot to add a font");
    NK_ASSERT(!ctx->current && "if this triggers you missed a `nk_end` call");
    if (!ctx || ctx->current || !title || !name)
        return 0;

    /* find or create window */
    style = &ctx->style;
    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) {
        /* create new window */
        nk_size name_length = (nk_size)nk_strlen(name);
        win = (struct nk_window*)nk_create_window(ctx);
        NK_ASSERT(win);
        if (!win) return 0;

        if (flags & NK_WINDOW_BACKGROUND)
            nk_insert_window(ctx, win, NK_INSERT_FRONT);
        else nk_insert_window(ctx, win, NK_INSERT_BACK);
        nk_command_buffer_init(&win->buffer, &ctx->memory, NK_CLIPPING_ON);

        win->flags = flags;
        win->bounds = bounds;
        win->name = title_hash;
        name_length = NK_MIN(name_length, NK_WINDOW_MAX_NAME-1);
        NK_MEMCPY(win->name_string, name, name_length);
        win->name_string[name_length] = 0;
        win->popup.win = 0;
        if (!ctx->active)
            ctx->active = win;
    } else {
        /* update window */
        win->flags &= ~(nk_flags)(NK_WINDOW_PRIVATE-1);
        win->flags |= flags;
        NK_ASSERT(win->seq != ctx->seq && "if this triggers you probably have two windows with same name!");
        win->seq = ctx->seq;
        if (!ctx->active)
            ctx->active = win;
    }
    if (win->flags & NK_WINDOW_HIDDEN) {
        ctx->current = win;
        return 0;
    }

    /* window overlapping */
    if (!(win->flags & NK_WINDOW_HIDDEN))
    {
        int inpanel, ishovered;
        const struct nk_window *iter = win;
        float h = ctx->style.font->height + 2.0f * style->window.header.padding.y +
            (2.0f * style->window.header.label_padding.y);
        struct nk_rect win_bounds = (!(win->flags & NK_WINDOW_MINIMIZED))?
            win->bounds: nk_rect(win->bounds.x, win->bounds.y, win->bounds.w, h);

        /* activate window if hovered and no other window is overlapping this window */
        nk_start(ctx, win);
        inpanel = nk_input_has_mouse_click_down_in_rect(&ctx->input, NK_BUTTON_LEFT, win_bounds, nk_true);
        inpanel = inpanel && ctx->input.mouse.buttons[NK_BUTTON_LEFT].clicked;
        ishovered = nk_input_is_mouse_hovering_rect(&ctx->input, win_bounds);
        if ((win != ctx->active) && ishovered && !ctx->input.mouse.buttons[NK_BUTTON_LEFT].down) {
            iter = win->next;
            while (iter) {
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                    iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    (!(iter->flags & NK_WINDOW_HIDDEN) || !(iter->flags & NK_WINDOW_BACKGROUND)))
                    break;

                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win->bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }

        /* activate window if clicked */
        if (iter && inpanel && (win != ctx->end) && !(iter->flags & NK_WINDOW_BACKGROUND)) {
            iter = win->next;
            while (iter) {
                /* try to find a panel with higher priority in the same position */
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INBOX(ctx->input.mouse.pos.x, ctx->input.mouse.pos.y,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    !(iter->flags & NK_WINDOW_HIDDEN))
                    break;
                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }

        if (!iter && ctx->end != win) {
            if (!(win->flags & NK_WINDOW_BACKGROUND)) {
                /* current window is active in that position so transfer to top
                 * at the highest priority in stack */
                nk_remove_window(ctx, win);
                nk_insert_window(ctx, win, NK_INSERT_BACK);
            }
            win->flags &= ~(nk_flags)NK_WINDOW_ROM;
            ctx->active = win;
        }
        if (ctx->end != win && !(win->flags & NK_WINDOW_BACKGROUND))
            win->flags |= NK_WINDOW_ROM;
    }

    win->layout = (struct nk_panel*)nk_create_panel(ctx);
    ctx->current = win;
    ret = nk_panel_begin(ctx, title, NK_PANEL_WINDOW);
    win->layout->offset = &win->scrollbar;
    return ret;
}